

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall CGL::Matrix4x4::operator*(Matrix4x4 *this,Matrix4x4 *B)

{
  Vector4D *u;
  double *pdVar1;
  Matrix4x4 *in_RSI;
  Matrix4x4 *in_RDI;
  double dVar2;
  int j;
  int i;
  Matrix4x4 *A;
  Matrix4x4 *C;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Matrix4x4 *in_stack_ffffffffffffff80;
  Matrix4x4 *in_stack_ffffffffffffff90;
  double z;
  Vector4D local_48;
  int local_28;
  int local_24;
  Matrix4x4 *local_20;
  
  local_20 = in_RSI;
  Matrix4x4(in_stack_ffffffffffffff90);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      u = operator[](local_20,local_24);
      pdVar1 = operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff80 = (Matrix4x4 *)*pdVar1;
      pdVar1 = operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      dVar2 = *pdVar1;
      pdVar1 = operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      z = *pdVar1;
      pdVar1 = operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      Vector4D::Vector4D(&local_48,(double)in_stack_ffffffffffffff80,dVar2,z,*pdVar1);
      dVar2 = dot(u,&local_48);
      pdVar1 = operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      *pdVar1 = dVar2;
    }
  }
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::operator*(const Matrix4x4 &B) const {
  const Matrix4x4 &A(*this);
  Matrix4x4 C;

  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
#ifdef __AVX__
      C(i, j) = dot(A[i], Vector4D(B(0, j), B(1, j), B(2, j), B(3, j)));
#else
      C(i, j) = 0.;

      for (int k = 0; k < 4; k++) {
        C(i, j) += A(i, k) * B(k, j);
      }
#endif
    }
  }

  return C;
}